

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O0

bool __thiscall
wasm::MemoryPacking::canOptimize
          (MemoryPacking *this,
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          *memories,
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          *dataSegments)

{
  Span span_00;
  Address AVar1;
  bool bVar2;
  size_type sVar3;
  pointer this_00;
  PassOptions *pPVar4;
  Address *pAVar5;
  reference puVar6;
  pointer pDVar7;
  Const *pCVar8;
  uint64_t uVar9;
  address64_t aVar10;
  ostream *poVar11;
  Span span;
  Address start;
  Const *c_1;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *__range1_1;
  DisjointSpans space;
  Const *c;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *__range1;
  Address maxAddress;
  value_type *memory;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *dataSegments_local;
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  *memories_local;
  MemoryPacking *this_local;
  
  bVar2 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(memories);
  if ((bVar2) ||
     (sVar3 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::size(memories), 1 < sVar3)) {
    this_local._7_1_ = false;
  }
  else {
    maxAddress.addr =
         (address64_t)
         std::
         vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ::operator[](memories,0);
    this_00 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                        ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                         maxAddress.addr);
    bVar2 = Importable::imported(&this_00->super_Importable);
    if ((bVar2) &&
       (pPVar4 = Pass::getPassOptions(&this->super_Pass), (pPVar4->zeroFilledMemory & 1U) == 0)) {
      this_local._7_1_ = false;
    }
    else {
      sVar3 = std::
              vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ::size(dataSegments);
      if (sVar3 < 2) {
        this_local._7_1_ = true;
      }
      else {
        wasm::Address::Address((Address *)&__range1,0);
        __end1 = std::
                 vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ::begin(dataSegments);
        segment = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                  std::
                  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                  ::end(dataSegments);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                                           *)&segment), bVar2) {
          puVar6 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                   ::operator*(&__end1);
          pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                   operator->(puVar6);
          if ((pDVar7->isPassive & 1U) == 0) {
            pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                     operator->(puVar6);
            pCVar8 = Expression::dynCast<wasm::Const>(pDVar7->offset);
            if (pCVar8 == (Const *)0x0) {
              return false;
            }
            uVar9 = wasm::Literal::getUnsigned(&pCVar8->value);
            pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                     operator->(puVar6);
            sVar3 = std::vector<char,_std::allocator<char>_>::size(&pDVar7->data);
            wasm::Address::Address
                      ((Address *)&space.spans._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       uVar9 + sVar3);
            pAVar5 = std::max<wasm::Address>
                               ((Address *)&__range1,
                                (Address *)
                                &space.spans._M_t._M_impl.super__Rb_tree_header._M_node_count);
            __range1 = (vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                        *)pAVar5->addr;
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
          ::operator++(&__end1);
        }
        DisjointSpans::DisjointSpans((DisjointSpans *)&__range1_1);
        __end1_1 = std::
                   vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ::begin(dataSegments);
        segment_1 = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                    std::
                    vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ::end(dataSegments);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                                   *)&segment_1), bVar2) {
          puVar6 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                   ::operator*(&__end1_1);
          pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                   operator->(puVar6);
          if ((pDVar7->isPassive & 1U) == 0) {
            pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                     operator->(puVar6);
            pCVar8 = Expression::cast<wasm::Const>(pDVar7->offset);
            uVar9 = wasm::Literal::getUnsigned(&pCVar8->value);
            wasm::Address::Address(&span.right,uVar9);
            AVar1 = span.right;
            aVar10 = wasm::Address::operator_cast_to_unsigned_long(&span.right);
            pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                     operator->(puVar6);
            sVar3 = std::vector<char,_std::allocator<char>_>::size(&pDVar7->data);
            wasm::Address::Address(&span.left,aVar10 + sVar3);
            span_00.right.addr = span.left.addr;
            span_00.left.addr = AVar1.addr;
            bVar2 = DisjointSpans::addAndCheckOverlap((DisjointSpans *)&__range1_1,span_00);
            if (bVar2) {
              poVar11 = std::operator<<((ostream *)&std::cerr,
                                        "warning: active memory segments have overlap, which ");
              std::operator<<(poVar11,"prevents some optimizations.\n");
              this_local._7_1_ = false;
              goto LAB_0180bef6;
            }
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
          ::operator++(&__end1_1);
        }
        this_local._7_1_ = true;
LAB_0180bef6:
        DisjointSpans::~DisjointSpans((DisjointSpans *)&__range1_1);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MemoryPacking::canOptimize(
  std::vector<std::unique_ptr<Memory>>& memories,
  std::vector<std::unique_ptr<DataSegment>>& dataSegments) {
  if (memories.empty() || memories.size() > 1) {
    return false;
  }
  auto& memory = memories[0];
  // We must optimize under the assumption that memory has been initialized to
  // zero. That is the case for a memory declared in the module, but for a
  // memory that is imported, we must be told that it is zero-initialized.
  if (memory->imported() && !getPassOptions().zeroFilledMemory) {
    return false;
  }

  // One segment is always ok to optimize, as it does not have the potential
  // problems handled below.
  if (dataSegments.size() <= 1) {
    return true;
  }
  // Check if it is ok for us to optimize.
  Address maxAddress = 0;
  for (auto& segment : dataSegments) {
    if (!segment->isPassive) {
      auto* c = segment->offset->dynCast<Const>();
      // If an active segment has a non-constant offset, then what gets written
      // cannot be known until runtime. That is, the active segments are written
      // out at startup, in order, and one may trample the data of another, like
      //
      //  (data (i32.const 100) "a")
      //  (data (i32.const 100) "\00")
      //
      // It is *not* ok to optimize out the zero in the last segment, as it is
      // actually needed, it will zero out the "a" that was written earlier. And
      // if a segment has an imported offset,
      //
      //  (data (i32.const 100) "a")
      //  (data (global.get $x) "\00")
      //
      // then we can't tell if that last segment will end up overwriting or not.
      // The only case we can easily handle is if there is just a single
      // segment, which we handled earlier. (Note that that includes the main
      // case of having a non-constant offset, dynamic linking, in which we have
      // a single segment.)
      if (!c) {
        return false;
      }
      // Note the maximum address so far.
      maxAddress = std::max(
        maxAddress, Address(c->value.getUnsigned() + segment->data.size()));
    }
  }
  // All active segments have constant offsets, known at this time, so we may be
  // able to optimize, but must still check for the trampling problem mentioned
  // earlier.
  // TODO: optimize in the trampling case
  DisjointSpans space;
  for (auto& segment : dataSegments) {
    if (!segment->isPassive) {
      auto* c = segment->offset->cast<Const>();
      Address start = c->value.getUnsigned();
      DisjointSpans::Span span{start, start + segment->data.size()};
      if (space.addAndCheckOverlap(span)) {
        std::cerr << "warning: active memory segments have overlap, which "
                  << "prevents some optimizations.\n";
        return false;
      }
    }
  }
  return true;
}